

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.hpp
# Opt level: O0

void __thiscall Experiments::Experiments(Experiments *this,int min,int max)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  __type _Var4;
  int local_28;
  int n;
  int local_14;
  int max_local;
  int min_local;
  Experiments *this_local;
  
  this->loops = 1000;
  std::vector<Experiments::Node,_std::allocator<Experiments::Node>_>::vector(&this->exps);
  _Var4 = std::log2<int>(max / min);
  this->size = (int)(_Var4 + 3.0);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->size;
  uVar2 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  piVar3 = (int *)operator_new__(uVar2);
  this->buf_sizes = piVar3;
  local_28 = 0;
  for (local_14 = min / 2; local_14 <= (max * 3) / 2; local_14 = local_14 << 1) {
    this->buf_sizes[local_28] = local_14;
    local_28 = local_28 + 1;
  }
  this->buf_sizes[local_28] = (max * 3) / 2;
  this->buffer = (uint *)0x0;
  return;
}

Assistant:

Experiments::Experiments(int min, int max) {
    size = log2(max / min) + 3;
    buf_sizes = new int[size];
    int n = 0;
    min /= 2;
    while (min <= max * 3 / 2)
    {
        buf_sizes[n++] = min;
        min *= 2;
    }
    buf_sizes[n++] = max * 3 / 2;
    buffer = nullptr;
}